

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O0

int anon_unknown.dwarf_1e829::ChannelOut_programchange(lua_State *L)

{
  ChannelOut *this;
  long xs_1;
  lua_Integer value;
  ChannelOut *self;
  lua_State *L_local;
  
  this = getChannelOut(L,1);
  xs_1 = luaL_checkinteger(L,2);
  if ((xs_1 < 0) || (0x7f < xs_1)) {
    luaL_argerror(L,2,"MIDI program number must be between 0 and 127");
  }
  ChannelOut::send<int,long_long>(this,this->index + 0xc0,xs_1);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_programchange(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer value = luaL_checkinteger(L, 2);

	luaL_argcheck(L, value >= 0 && value <= 0x7F, 2, "MIDI program number must be between 0 and 127");

	self.send(0xC0 + self.index, value);
	lua_settop(L, 1);
	return 1;
}